

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::
basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
::visit_begin_object
          (basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
           *this,semantic_tag param_2,ser_context *param_3,error_code *ec)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  size_t sVar4;
  int iVar5;
  container_type *in_RCX;
  error_code *in_RDX;
  long in_RDI;
  value_type ch;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar6;
  
  iVar5 = *(int *)(in_RDI + 0x170) + 1;
  *(int *)(in_RDI + 0x170) = iVar5;
  iVar2 = basic_json_options_common<wchar_t>::max_nesting_depth
                    ((basic_json_options_common<wchar_t> *)
                     (in_RDI + 0x10 + *(long *)(*(long *)(in_RDI + 0x10) + -0x18)));
  if (iVar2 < iVar5) {
    std::error_code::operator=(in_RDX,(json_errc)((ulong)in_RCX >> 0x20));
  }
  else {
    bVar1 = std::
            vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
            ::empty((vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
                     *)in_RDX);
    ch = (value_type)((ulong)in_RDI >> 0x20);
    if (!bVar1) {
      pvVar3 = std::
               vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
               ::back((vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
                       *)CONCAT44(in_stack_ffffffffffffffd4,iVar5));
      bVar1 = encoding_context::is_array(pvVar3);
      if (bVar1) {
        pvVar3 = std::
                 vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
                 ::back((vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
                         *)CONCAT44(in_stack_ffffffffffffffd4,iVar5));
        sVar4 = encoding_context::count(pvVar3);
        if (sVar4 != 0) {
          string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          ::push_back((string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                       *)CONCAT44(in_stack_ffffffffffffffd4,iVar5),ch);
        }
      }
    }
    uVar6 = 0;
    std::
    vector<jsoncons::basic_compact_json_encoder<wchar_t,jsoncons::string_sink<std::__cxx11::wstring>,std::allocator<char>>::encoding_context,std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,jsoncons::string_sink<std::__cxx11::wstring>,std::allocator<char>>::encoding_context>>
    ::
    emplace_back<jsoncons::basic_compact_json_encoder<wchar_t,jsoncons::string_sink<std::__cxx11::wstring>,std::allocator<char>>::container_type>
              ((vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
                *)in_RDX,in_RCX);
    string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::push_back((string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                 *)CONCAT44(uVar6,iVar5),ch);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_begin_object(semantic_tag, const ser_context&, std::error_code& ec) final
        {
            if (JSONCONS_UNLIKELY(++nesting_depth_ > options_.max_nesting_depth()))
            {
                ec = json_errc::max_nesting_depth_exceeded;
                JSONCONS_VISITOR_RETURN;
            } 
            if (!stack_.empty() && stack_.back().is_array() && stack_.back().count() > 0)
            {
                sink_.push_back(',');
            }

            stack_.emplace_back(container_type::object);
            sink_.push_back('{');
            JSONCONS_VISITOR_RETURN;
        }